

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ValueFederateManager::addTarget(ValueFederateManager *this,Input *inp,string_view target)

{
  InterfaceHandle *__k;
  ValueFederate *pVVar1;
  _func_int *p_Var2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  int iVar4;
  _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var5;
  undefined4 extraout_var;
  unique_lock<std::shared_mutex> *this_00;
  string_view message;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar6;
  allocator<char> local_fa;
  allocator<char> local_f9;
  string_view target_local;
  undefined1 local_e8 [32];
  handle iTHandle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  target_local._M_str = target._M_str;
  target_local._M_len = target._M_len;
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock(&iTHandle,&this->inputTargets);
  __k = &(inp->super_Interface).handle;
  pVar6 = std::
          _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(iTHandle.data)->_M_t,__k);
  _Var5 = pVar6.first._M_node;
  do {
    if (_Var5._M_node == pVar6.second._M_node._M_node) {
      std::unique_lock<std::shared_mutex>::~unique_lock(&iTHandle.m_handle_lock);
      (*this->coreObject->_vptr_Core[0x3e])
                (this->coreObject,(ulong)(uint)__k->hid,target_local._M_len,target_local._M_str,0x75
                );
      gmlc::libguarded::
      shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
      ::lock((handle *)local_e8,&this->inputTargets);
      std::
      _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
      ::
      _M_emplace_equal<helics::InterfaceHandle_const&,std::basic_string_view<char,std::char_traits<char>>&>
                ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::__cxx11::string>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::__cxx11::string>>>
                  *)local_e8._0_8_,__k,&target_local);
      std::unique_lock<std::shared_mutex>::~unique_lock
                ((unique_lock<std::shared_mutex> *)(local_e8 + 8));
      gmlc::libguarded::
      shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
      ::lock((handle *)local_e8,&this->targetIDs);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
      ::
      _M_emplace_equal<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                  *)local_e8._0_8_,&target_local,__k);
      this_00 = (unique_lock<std::shared_mutex> *)(local_e8 + 8);
LAB_001be185:
      std::unique_lock<std::shared_mutex>::~unique_lock(this_00);
      return;
    }
    __x._M_str = target_local._M_str;
    __x._M_len = target_local._M_len;
    __y._M_str = (char *)_Var5._M_node[1]._M_parent;
    __y._M_len = (size_t)_Var5._M_node[1]._M_left;
    bVar3 = std::operator==(__x,__y);
    if (bVar3) {
      pVVar1 = this->fed;
      p_Var2 = pVVar1->_vptr_ValueFederate[-3];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Duplicate input targets detected for ",&local_f9);
      iVar4 = (*(inp->super_Interface)._vptr_Interface[4])(inp);
      std::operator+(&local_70,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar4));
      std::operator+(&local_50,&local_70,"::");
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_b0,&target_local,&local_fa);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     &local_50,&local_b0);
      message._M_str = (char *)local_e8._0_8_;
      message._M_len = local_e8._8_8_;
      Federate::logWarningMessage
                ((Federate *)((long)&pVVar1->_vptr_ValueFederate + (long)p_Var2),message);
      std::__cxx11::string::~string((string *)local_e8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      this_00 = &iTHandle.m_handle_lock;
      goto LAB_001be185;
    }
    _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
  } while( true );
}

Assistant:

void ValueFederateManager::addTarget(const Input& inp, std::string_view target)
{
    {
        auto iTHandle = inputTargets.lock();
        auto rng = iTHandle->equal_range(inp.handle);
        for (auto el = rng.first; el != rng.second; ++el) {
            if (el->second == target) {
                fed->logWarningMessage(std::string("Duplicate input targets detected for ") +
                                       inp.getDisplayName() + "::" + std::string(target));
                return;
            }
        }
    }

    coreObject->addSourceTarget(inp.handle, target);

    inputTargets.lock()->emplace(inp.handle, target);
    targetIDs.lock()->emplace(target, inp.handle);
}